

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::init(WindingCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar3;
  RenderTarget *pRVar4;
  long *plVar5;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar6;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar7;
  TestError *this_01;
  size_type *psVar8;
  _Base_ptr p_Var9;
  pointer pbVar10;
  Context *code;
  deInt32 *pdVar11;
  long lVar12;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string local_2a0;
  string local_280;
  Context *local_260;
  undefined8 local_258;
  Context local_250;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  pointer local_218;
  value_type local_210;
  size_type *local_1f0;
  value_type local_1e8;
  _Base_ptr local_1c8;
  value_type local_1c0;
  Context *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  ContextInfo *local_180;
  undefined1 local_170 [16];
  ContextInfo *local_160;
  undefined1 local_150 [24];
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar4->m_width,
             (RenderTarget *)(ulong)(uint)pRVar4->m_height,0x40);
  local_160 = (ContextInfo *)local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,"${GLSL_VERSION_DECL}\n\nvoid main (void)\n{\n}\n","");
  local_180 = (ContextInfo *)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n\tgl_TessLevelOuter[0] = 5.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 5.0;\n}\n"
             ,"");
  local_260 = &local_250;
  local_258 = 0;
  local_250.m_testCtx._0_1_ = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_1e8._M_string_length = *psVar8;
    local_1e8.field_2._M_allocated_capacity = plVar5[3];
    local_1f0 = &local_1e8._M_string_length;
  }
  else {
    local_1e8._M_string_length = *psVar8;
    local_1f0 = (size_type *)*plVar5;
  }
  local_1e8._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  p_Var9 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var9) {
    local_1c0._M_string_length = *(size_type *)p_Var9;
    local_1c0.field_2._M_allocated_capacity = plVar5[3];
    local_1c8 = (_Base_ptr)&local_1c0._M_string_length;
  }
  else {
    local_1c0._M_string_length = *(size_type *)p_Var9;
    local_1c8 = (_Base_ptr)*plVar5;
  }
  local_1c0._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  pCVar7 = (ContextInfo *)(plVar5 + 2);
  if ((ContextInfo *)*plVar5 == pCVar7) {
    local_238._8_8_ = pCVar7->_vptr_ContextInfo;
    aStack_228._M_allocated_capacity = plVar5[3];
    local_250.m_contextInfo = (ContextInfo *)(local_238 + 8);
  }
  else {
    local_238._8_8_ = pCVar7->_vptr_ContextInfo;
    local_250.m_contextInfo = (ContextInfo *)*plVar5;
  }
  local_238._0_8_ = plVar5[1];
  *plVar5 = (long)pCVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250.m_contextInfo);
  pbVar10 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar10) {
    local_210._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    local_210.field_2._M_allocated_capacity = plVar5[3];
    local_218 = (pointer)&local_210._M_string_length;
  }
  else {
    local_210._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    local_218 = (pointer)*plVar5;
  }
  local_210._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)pbVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
  p_Var9 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var9) {
    local_100._16_8_ = *(undefined8 *)p_Var9;
    pbStack_e8 = (pointer)plVar5[3];
    local_100._0_8_ = (_Base_ptr)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ = *(undefined8 *)p_Var9;
    local_100._0_8_ = (_Base_ptr)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2a0.field_2._M_allocated_capacity = *psVar8;
    local_2a0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar8;
    local_2a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2a0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != (_Base_ptr)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_218 != (pointer)&local_210._M_string_length) {
    operator_delete(local_218,(ulong)(local_210._M_string_length + 1));
  }
  if (local_250.m_contextInfo != (ContextInfo *)(local_238 + 8)) {
    operator_delete(local_250.m_contextInfo,local_238._8_8_ + 1);
  }
  if (local_1c8 != (_Base_ptr)&local_1c0._M_string_length) {
    operator_delete(local_1c8,local_1c0._M_string_length + 1);
  }
  if (local_1f0 != &local_1e8._M_string_length) {
    operator_delete(local_1f0,local_1e8._M_string_length + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(local_250.m_testCtx._1_7_,local_250.m_testCtx._0_1_) + 1);
  }
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x1c4562f);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar5[3];
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_280._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_1a0 = (Context *)local_190;
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_190._0_8_ = code->m_testCtx;
    local_190._8_8_ = plVar5[3];
  }
  else {
    local_190._0_8_ = code->m_testCtx;
    local_1a0 = (Context *)*plVar5;
  }
  local_198 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar2->m_renderCtx,(Context *)local_160,
             (char *)code);
  local_218 = (pointer)((ulong)local_218 & 0xffffffff00000000);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_218 & 0xffffffff) * 0x18),&local_210);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_180,(char *)code);
  local_250.m_contextInfo = (ContextInfo *)CONCAT44(local_250.m_contextInfo._4_4_,3);
  local_238._0_8_ = &aStack_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_250.m_contextInfo & 0xffffffff) * 0x18),
              (value_type *)local_238);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_1a0,(char *)code);
  local_1c8 = (_Base_ptr)CONCAT44(local_1c8._4_4_,4);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1c8 & 0xffffffff) * 0x18),&local_1c0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_150 + 0x10),
             (_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,local_260,
             (char *)code);
  local_1f0 = (size_type *)CONCAT44(local_1f0._4_4_,1);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_150._16_8_,
             (long)&(local_138->_M_dataplus)._M_p + local_150._16_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1f0 & 0xffffffff) * 0x18),&local_1e8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_100);
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar6->strongRefCount;
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  pSVar3 = (this->m_program).m_state;
  if (pSVar3 != pSVar6) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar11 = &pSVar3->strongRefCount;
      *pdVar11 = *pdVar11 + -1;
      UNLOCK();
      if (*pdVar11 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar11 = &((this->m_program).m_state)->weakRefCount;
      *pdVar11 = *pdVar11 + -1;
      UNLOCK();
      if (*pdVar11 == 0) {
        pSVar3 = (this->m_program).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar11 = &((this->m_program).m_state)->weakRefCount;
    *pdVar11 = *pdVar11 + 1;
    UNLOCK();
  }
  pdVar11 = &pSVar6->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
  }
  LOCK();
  *pdVar11 = *pdVar11 + -1;
  UNLOCK();
  if (*pdVar11 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._16_8_ != &local_130) {
    operator_delete((void *)local_150._16_8_,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != &aStack_228) {
    operator_delete((void *)local_238._0_8_,aStack_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_260 != &local_250) {
      operator_delete(local_260,CONCAT71(local_250.m_testCtx._1_7_,local_250.m_testCtx._0_1_) + 1);
    }
    if (local_1a0 != (Context *)local_190) {
      operator_delete(local_1a0,(ulong)((long)(Platform **)local_190._0_8_ + 1));
    }
    if (local_180 != (ContextInfo *)local_170) {
      operator_delete(local_180,(ulong)((long)(Platform **)local_170._0_8_ + 1));
    }
    pCVar7 = (ContextInfo *)local_150;
    if (local_160 != pCVar7) {
      operator_delete(local_160,(ulong)((long)(Platform **)local_150._0_8_ + 1));
      pCVar7 = extraout_RAX;
    }
    return (int)pCVar7;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xae0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void WindingCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = 1) out;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 5.0;\n"
													 "	gl_TessLevelOuter[1] = 5.0;\n"
													 "	gl_TessLevelOuter[2] = 5.0;\n"
													 "	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_winding) +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_Position = vec4(gl_TessCoord.xy*2.0 - 1.0, 0.0, 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}